

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O1

string_view __thiscall slang::ast::CoverageOptionSetter::getName(CoverageOptionSetter *this)

{
  ExpressionSyntax *pEVar1;
  bool bVar2;
  int *piVar3;
  int *in_RDX;
  string_view sVar4;
  
  pEVar1 = (((this->syntax).ptr)->expr).ptr;
  if ((pEVar1->super_SyntaxNode).kind == AssignmentExpression) {
    piVar3 = *(int **)&pEVar1[1].super_SyntaxNode;
    bVar2 = true;
    if (((*piVar3 == 0x1a1) && (in_RDX = *(int **)(piVar3 + 6), *in_RDX == 0xe5)) &&
       (**(int **)(piVar3 + 0xc) == 0xe5)) {
      sVar4 = parsing::Token::valueText((Token *)(*(int **)(piVar3 + 0xc) + 6));
      in_RDX = (int *)sVar4._M_str;
      piVar3 = (int *)sVar4._M_len;
      bVar2 = false;
    }
    if (!bVar2) goto LAB_0078d028;
  }
  in_RDX = (int *)0xa04334;
  piVar3 = (int *)0x0;
LAB_0078d028:
  sVar4._M_str = (char *)in_RDX;
  sVar4._M_len = (size_t)piVar3;
  return sVar4;
}

Assistant:

constexpr T get() const {
        SLANG_ASSERT(ptr);
        return ptr;
    }